

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::D3MFExporter::writeBuild(D3MFExporter *this)

{
  ostream *poVar1;
  size_type sVar2;
  ulong local_18;
  size_t i;
  D3MFExporter *this_local;
  
  poVar1 = std::operator<<((ostream *)&this->mModelOutput,"<");
  poVar1 = std::operator<<(poVar1,(string *)XmlTag::build_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,">");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->mBuildItems);
    if (sVar2 <= local_18) break;
    poVar1 = std::operator<<((ostream *)&this->mModelOutput,"<");
    poVar1 = std::operator<<(poVar1,(string *)XmlTag::item_abi_cxx11_);
    poVar1 = std::operator<<(poVar1," objectid=\"");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18 + 1);
    std::operator<<(poVar1,"\"/>");
    std::ostream::operator<<(&this->mModelOutput,std::endl<char,std::char_traits<char>>);
    local_18 = local_18 + 1;
  }
  poVar1 = std::operator<<((ostream *)&this->mModelOutput,"</");
  poVar1 = std::operator<<(poVar1,(string *)XmlTag::build_abi_cxx11_);
  std::operator<<(poVar1,">");
  std::ostream::operator<<(&this->mModelOutput,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void D3MFExporter::writeBuild() {
    mModelOutput << "<" << XmlTag::build << ">" << std::endl;

    for ( size_t i = 0; i < mBuildItems.size(); ++i ) {
        mModelOutput << "<" << XmlTag::item << " objectid=\"" << i + 1 << "\"/>";
        mModelOutput << std::endl;
    }
    mModelOutput << "</" << XmlTag::build << ">";
    mModelOutput << std::endl;
}